

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<float_const&>::
captureExpression<(Catch::Internal::Operator)0,Catch::Detail::Approx>
          (ExpressionLhs<float_const&> *this,Approx *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  Catch *this_00;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  result = Internal::Evaluator<float,_Catch::Detail::Approx,_(Catch::Internal::Operator)0>::evaluate
                     (*(float **)(this + 8),rhs);
  this_00 = (Catch *)(ulong)result;
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  Catch::toString_abi_cxx11_(&local_38,this_00,**(float **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Detail::Approx::toString_abi_cxx11_(&local_58,rhs);
  pRVar1 = ResultBuilder::setRhs(pRVar1,(string *)&local_58);
  std::__cxx11::string::string((string *)&local_78,"==",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }